

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t vbmi2_256_despace(char *bytes,size_t howmany)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  uint uVar11;
  undefined1 (*pauVar12) [32];
  ulong in_RSI;
  long in_RDI;
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  char c;
  __mmask32 notwhite;
  __mmask32 notcarriage;
  __mmask32 notnewline;
  __mmask32 notspaces;
  __m256i x;
  size_t i;
  __m256i carriage;
  __m256i newline;
  __m256i spaces;
  size_t pos;
  undefined2 local_230;
  ulong local_1e8;
  size_t local_168;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_168 = 0;
  auVar2 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar2 = vpinsrb_avx(auVar2,0x20,2);
  auVar2 = vpinsrb_avx(auVar2,0x20,3);
  auVar2 = vpinsrb_avx(auVar2,0x20,4);
  auVar2 = vpinsrb_avx(auVar2,0x20,5);
  auVar2 = vpinsrb_avx(auVar2,0x20,6);
  auVar2 = vpinsrb_avx(auVar2,0x20,7);
  auVar2 = vpinsrb_avx(auVar2,0x20,8);
  auVar2 = vpinsrb_avx(auVar2,0x20,9);
  auVar2 = vpinsrb_avx(auVar2,0x20,10);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xc);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xd);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar3 = vpinsrb_avx(auVar3,0x20,2);
  auVar3 = vpinsrb_avx(auVar3,0x20,3);
  auVar3 = vpinsrb_avx(auVar3,0x20,4);
  auVar3 = vpinsrb_avx(auVar3,0x20,5);
  auVar3 = vpinsrb_avx(auVar3,0x20,6);
  auVar3 = vpinsrb_avx(auVar3,0x20,7);
  auVar3 = vpinsrb_avx(auVar3,0x20,8);
  auVar3 = vpinsrb_avx(auVar3,0x20,9);
  auVar3 = vpinsrb_avx(auVar3,0x20,10);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xb);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xc);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xd);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xe);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xf);
  uStack_f0 = auVar3._0_8_;
  uStack_e8 = auVar3._8_8_;
  auVar3 = vpinsrb_avx(ZEXT116(10),10,1);
  auVar3 = vpinsrb_avx(auVar3,10,2);
  auVar3 = vpinsrb_avx(auVar3,10,3);
  auVar3 = vpinsrb_avx(auVar3,10,4);
  auVar3 = vpinsrb_avx(auVar3,10,5);
  auVar3 = vpinsrb_avx(auVar3,10,6);
  auVar3 = vpinsrb_avx(auVar3,10,7);
  auVar3 = vpinsrb_avx(auVar3,10,8);
  auVar3 = vpinsrb_avx(auVar3,10,9);
  auVar3 = vpinsrb_avx(auVar3,10,10);
  auVar3 = vpinsrb_avx(auVar3,10,0xb);
  auVar3 = vpinsrb_avx(auVar3,10,0xc);
  auVar3 = vpinsrb_avx(auVar3,10,0xd);
  auVar3 = vpinsrb_avx(auVar3,10,0xe);
  auVar3 = vpinsrb_avx(auVar3,10,0xf);
  auVar4 = vpinsrb_avx(ZEXT116(10),10,1);
  auVar4 = vpinsrb_avx(auVar4,10,2);
  auVar4 = vpinsrb_avx(auVar4,10,3);
  auVar4 = vpinsrb_avx(auVar4,10,4);
  auVar4 = vpinsrb_avx(auVar4,10,5);
  auVar4 = vpinsrb_avx(auVar4,10,6);
  auVar4 = vpinsrb_avx(auVar4,10,7);
  auVar4 = vpinsrb_avx(auVar4,10,8);
  auVar4 = vpinsrb_avx(auVar4,10,9);
  auVar4 = vpinsrb_avx(auVar4,10,10);
  auVar4 = vpinsrb_avx(auVar4,10,0xb);
  auVar4 = vpinsrb_avx(auVar4,10,0xc);
  auVar4 = vpinsrb_avx(auVar4,10,0xd);
  auVar4 = vpinsrb_avx(auVar4,10,0xe);
  auVar4 = vpinsrb_avx(auVar4,10,0xf);
  uStack_b0 = auVar4._0_8_;
  uStack_a8 = auVar4._8_8_;
  auVar4 = vpinsrb_avx(ZEXT116(0xd),0xd,1);
  auVar4 = vpinsrb_avx(auVar4,0xd,2);
  auVar4 = vpinsrb_avx(auVar4,0xd,3);
  auVar4 = vpinsrb_avx(auVar4,0xd,4);
  auVar4 = vpinsrb_avx(auVar4,0xd,5);
  auVar4 = vpinsrb_avx(auVar4,0xd,6);
  auVar4 = vpinsrb_avx(auVar4,0xd,7);
  auVar4 = vpinsrb_avx(auVar4,0xd,8);
  auVar4 = vpinsrb_avx(auVar4,0xd,9);
  auVar4 = vpinsrb_avx(auVar4,0xd,10);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xb);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xc);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xd);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xe);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xf);
  auVar5 = vpinsrb_avx(ZEXT116(0xd),0xd,1);
  auVar5 = vpinsrb_avx(auVar5,0xd,2);
  auVar5 = vpinsrb_avx(auVar5,0xd,3);
  auVar5 = vpinsrb_avx(auVar5,0xd,4);
  auVar5 = vpinsrb_avx(auVar5,0xd,5);
  auVar5 = vpinsrb_avx(auVar5,0xd,6);
  auVar5 = vpinsrb_avx(auVar5,0xd,7);
  auVar5 = vpinsrb_avx(auVar5,0xd,8);
  auVar5 = vpinsrb_avx(auVar5,0xd,9);
  auVar5 = vpinsrb_avx(auVar5,0xd,10);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xb);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xc);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xd);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xe);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xf);
  auVar14 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  uStack_70 = auVar14._0_8_;
  uStack_68 = auVar14._8_8_;
  for (local_1e8 = 0; local_1e8 + 0x1f < in_RSI; local_1e8 = local_1e8 + 0x20) {
    pauVar12 = (undefined1 (*) [32])(in_RDI + local_1e8);
    auVar10._16_8_ = uStack_f0;
    auVar10._0_16_ = auVar2;
    auVar10._24_8_ = uStack_e8;
    uVar6 = vpcmpb_avx512vl(*pauVar12,auVar10,4);
    auVar9._16_8_ = uStack_b0;
    auVar9._0_16_ = auVar3;
    auVar9._24_8_ = uStack_a8;
    uVar7 = vpcmpb_avx512vl(*pauVar12,auVar9,4);
    auVar13._16_8_ = uStack_70;
    auVar13._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
    auVar13._24_8_ = uStack_68;
    uVar8 = vpcmpb_avx512vl(*pauVar12,auVar13,4);
    uVar11 = (uint)uVar6 & (uint)uVar7 & (uint)uVar8;
    local_230 = (undefined2)uVar11;
    auVar13 = vpcompressw_avx512_vbmi2
                        (*pauVar12,
                         CONCAT62((int6)((ulong)(in_RDI + local_168) >> 0x10),local_230) &
                         0xffffffff);
    *(undefined1 (*) [32])(in_RDI + local_168) = auVar13;
    local_168 = (long)POPCOUNT(uVar11) + local_168;
  }
  for (; local_1e8 < in_RSI; local_1e8 = local_1e8 + 1) {
    cVar1 = *(char *)(in_RDI + local_1e8);
    if (((cVar1 != '\r') && (cVar1 != '\n')) && (cVar1 != ' ')) {
      *(char *)(in_RDI + local_168) = cVar1;
      local_168 = local_168 + 1;
    }
  }
  return local_168;
}

Assistant:

size_t vbmi2_256_despace(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m256i spaces = _mm256_set1_epi8(' ');
  __m256i newline = _mm256_set1_epi8('\n');
  __m256i carriage = _mm256_set1_epi8('\r');
  size_t i = 0;
  for (; i + 31 < howmany; i += 32) {
    __m256i x = _mm256_loadu_si256((const __m256i *)(bytes + i));
    __mmask32  notspaces = _mm256_cmpneq_epi8_mask (x, spaces);
    __mmask32  notnewline = _mm256_cmpneq_epi8_mask (x, newline);
    __mmask32  notcarriage = _mm256_cmpneq_epi8_mask (x, carriage);
    __mmask32  notwhite = notspaces & notnewline & notcarriage;
    _mm256_mask_compressstoreu_epi16  (bytes + pos, notwhite, x);
    pos += _popcnt32(notwhite);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}